

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlChar *pxVar1;
  xmlXPathObjectPtr value;
  xmlChar *local_38;
  xmlChar *result;
  xmlChar *point;
  xmlXPathObjectPtr find;
  xmlXPathObjectPtr str;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 2) {
      if (ctxt->valueNr < 2) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        obj = xmlXPathValuePop(ctxt);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        obj_00 = xmlXPathValuePop(ctxt);
        if (ctxt->error == 0) {
          pxVar1 = xmlStrstr(obj_00->stringval,obj->stringval);
          if (pxVar1 == (xmlChar *)0x0) {
            local_38 = xmlStrdup("");
          }
          else {
            local_38 = xmlStrndup(obj_00->stringval,(int)pxVar1 - (int)obj_00->stringval);
          }
          if (local_38 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          else {
            value = xmlXPathCacheWrapString(ctxt,local_38);
            xmlXPathValuePush(ctxt,value);
          }
        }
        xmlXPathReleaseObject(ctxt->context,obj_00);
        xmlXPathReleaseObject(ctxt->context,obj);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr find = NULL;
    const xmlChar *point;
    xmlChar *result;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    find = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    point = xmlStrstr(str->stringval, find->stringval);
    if (point == NULL) {
        result = xmlStrdup(BAD_CAST "");
    } else {
        result = xmlStrndup(str->stringval, point - str->stringval);
    }
    if (result == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, result));

error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, find);
}